

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

int amqpvalue_get_float(AMQP_VALUE value,float *float_value)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || float_value == (float *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x2d5;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_float",0x2d4,1,"Bad arguments: value = %p, float_value = %p",value,
                float_value);
    }
  }
  else if (value->type == AMQP_TYPE_FLOAT) {
    *float_value = (float)(value->value).uint_value;
    iVar2 = 0;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    iVar2 = 0x2de;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
                ,"amqpvalue_get_float",0x2dd,1,"Value is not of type FLOAT");
    }
  }
  return iVar2;
}

Assistant:

int amqpvalue_get_float(AMQP_VALUE value, float* float_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_084: [If any of the arguments is NULL then amqpvalue_get_float shall return a non-zero value.] */
    if ((value == NULL) ||
        (float_value == NULL))
    {
        LogError("Bad arguments: value = %p, float_value = %p",
            value, float_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_085: [If the type of the value is not float (was not created with amqpvalue_create_float), then amqpvalue_get_float shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_FLOAT)
        {
            LogError("Value is not of type FLOAT");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_082: [amqpvalue_get_float shall fill in the float_value argument the float value stored by the AMQP value indicated by the value argument.] */
            *float_value = value_data->value.float_value;

            /* Codes_SRS_AMQPVALUE_01_083: [On success amqpvalue_get_float shall return 0.] */
            result = 0;
        }
    }

    return result;
}